

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O0

bool cmSystemTools::SplitProgramFromArgs(string *command,string *program,string *args)

{
  byte bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool in_single;
  bool in_double;
  char *pcStack_28;
  bool in_escape;
  char *c;
  string *args_local;
  string *program_local;
  string *command_local;
  
  pcStack_28 = (char *)std::__cxx11::string::c_str();
  while (bVar3 = cmIsSpace(*pcStack_28), bVar3) {
    pcStack_28 = pcStack_28 + 1;
  }
  bVar2 = false;
  bVar1 = 0;
  bVar3 = false;
  for (; *pcStack_28 != '\0'; pcStack_28 = pcStack_28 + 1) {
    if (bVar3) {
      if (*pcStack_28 == '\'') {
        bVar3 = false;
      }
      else {
        std::__cxx11::string::operator+=((string *)program,*pcStack_28);
      }
    }
    else if (bVar2) {
      bVar2 = false;
      std::__cxx11::string::operator+=((string *)program,*pcStack_28);
    }
    else if (*pcStack_28 == '\\') {
      bVar2 = true;
    }
    else if (bVar1 == 0) {
      if (*pcStack_28 == '\"') {
        bVar1 = 1;
      }
      else if (*pcStack_28 == '\'') {
        bVar3 = true;
      }
      else {
        bVar4 = cmIsSpace(*pcStack_28);
        if (bVar4) break;
        std::__cxx11::string::operator+=((string *)program,*pcStack_28);
      }
    }
    else if (*pcStack_28 == '\"') {
      bVar1 = 0;
    }
    else {
      std::__cxx11::string::operator+=((string *)program,*pcStack_28);
    }
  }
  std::__cxx11::string::operator=((string *)args,pcStack_28);
  bVar4 = false;
  if ((!bVar3) && (bVar4 = false, !bVar2)) {
    bVar4 = (bool)(bVar1 ^ 1);
  }
  return bVar4;
}

Assistant:

bool cmSystemTools::SplitProgramFromArgs(std::string const& command,
                                         std::string& program,
                                         std::string& args)
{
  const char* c = command.c_str();

  // Skip leading whitespace.
  while (cmIsSpace(*c)) {
    ++c;
  }

  // Parse one command-line element up to an unquoted space.
  bool in_escape = false;
  bool in_double = false;
  bool in_single = false;
  for (; *c; ++c) {
    if (in_single) {
      if (*c == '\'') {
        in_single = false;
      } else {
        program += *c;
      }
    } else if (in_escape) {
      in_escape = false;
      program += *c;
    } else if (*c == '\\') {
      in_escape = true;
    } else if (in_double) {
      if (*c == '"') {
        in_double = false;
      } else {
        program += *c;
      }
    } else if (*c == '"') {
      in_double = true;
    } else if (*c == '\'') {
      in_single = true;
    } else if (cmIsSpace(*c)) {
      break;
    } else {
      program += *c;
    }
  }

  // The remainder of the command line holds unparsed arguments.
  args = c;

  return !in_single && !in_escape && !in_double;
}